

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<bool_const&,pbrt::Point3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,float_const&,float_const&,float_const&,pbrt::SampledSpectrum_const&>
               (string *s,char *fmt,bool *v,Point3<float> *args,Normal3<float> *args_1,
               Normal3<float> *args_2,float *args_3,float *args_4,float *args_5,
               SampledSpectrum *args_6)

{
  long lVar1;
  ulong uVar2;
  bool *v_00;
  byte *in_RDX;
  char *pcVar3;
  string *in_RDI;
  SampledSpectrum *in_R9;
  byte bVar4;
  byte bVar5;
  undefined1 uVar6;
  Point3<float> *in_stack_00000008;
  bool *in_stack_00000010;
  string *in_stack_00000018;
  char *in_stack_00000020;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string *in_stack_fffffffffffffd60;
  char **in_stack_fffffffffffffd68;
  Normal3<float> *in_stack_fffffffffffffd70;
  float *in_stack_fffffffffffffd78;
  float *in_stack_fffffffffffffd80;
  float *in_stack_fffffffffffffd88;
  SampledSpectrum *in_stack_fffffffffffffd90;
  string local_268 [32];
  undefined8 local_248;
  string local_240 [24];
  char *in_stack_fffffffffffffdd8;
  stringstream local_220 [4];
  int in_stack_fffffffffffffde4;
  char *in_stack_fffffffffffffde8;
  undefined1 local_210 [4];
  LogLevel in_stack_fffffffffffffdf4;
  string local_98 [16];
  float *in_stack_ffffffffffffff78;
  Normal3<float> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  Point3<float> *in_stack_ffffffffffffff90;
  undefined5 in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  float *in_stack_ffffffffffffffb0;
  float *in_stack_ffffffffffffffb8;
  
  copyToFormatString(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffffa0,0x2a);
  bVar4 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffffa0,0x73);
  bVar5 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffffa0,100);
  uVar6 = lVar1 != -1;
  if ((bVar4 & 1) == 0) {
    if ((bVar5 & 1) == 0) {
      if ((bool)uVar6) {
        uVar2 = std::__cxx11::string::find((char)&stack0xffffffffffffffa0,100);
        v_00 = (bool *)IntegerFormatTrait<bool>::fmt();
        std::__cxx11::string::replace((ulong)&stack0xffffffffffffffa0,uVar2,(char *)0x1);
        std::__cxx11::string::c_str();
        formatOne<bool_const&>((char *)in_stack_fffffffffffffd78,v_00);
        std::__cxx11::string::operator+=(in_RDI,local_98);
        std::__cxx11::string::~string(local_98);
      }
      else if ((bVar5 & 1) == 0) {
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) != 0) {
          LogFatal(in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                   in_stack_fffffffffffffdd8);
        }
        std::__cxx11::string::c_str();
        formatOne<bool_const&>((char *)in_stack_fffffffffffffd78,(bool *)in_stack_fffffffffffffd70);
        std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd78);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffd78);
      }
      else {
        std::__cxx11::stringstream::stringstream(local_220);
        std::ostream::operator<<(local_210,(bool)(*in_RDX & 1));
        std::__cxx11::string::c_str();
        std::__cxx11::stringstream::str();
        local_248 = std::__cxx11::string::c_str();
        formatOne<char_const*>((char *)in_stack_fffffffffffffd78,(char **)in_stack_fffffffffffffd70)
        ;
        std::__cxx11::string::operator+=(in_RDI,local_240);
        std::__cxx11::string::~string(local_240);
        std::__cxx11::string::~string(local_268);
        std::__cxx11::stringstream::~stringstream(local_220);
      }
    }
    else {
      pcVar3 = "false";
      if ((*in_RDX & 1) != 0) {
        pcVar3 = "true";
      }
      std::__cxx11::string::operator+=(in_RDI,pcVar3);
    }
    stringPrintfRecursive<pbrt::Point3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,float_const&,float_const&,float_const&,pbrt::SampledSpectrum_const&>
              (in_stack_ffffffffffffffa0,
               (char *)CONCAT17(bVar4,CONCAT16(bVar5,CONCAT15(uVar6,in_stack_ffffffffffffff98))),
               in_stack_ffffffffffffff90,
               (Normal3<float> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffb8,in_R9);
  }
  else {
    stringPrintfRecursiveWithPrecision<bool_const&,pbrt::Point3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,float_const&,float_const&,float_const&,pbrt::SampledSpectrum_const&>
              (in_stack_fffffffffffffd60,in_stack_00000020,in_stack_00000018,in_stack_00000010,
               in_stack_00000008,(Normal3<float> *)in_R9,in_stack_fffffffffffffd70,
               in_stack_fffffffffffffd78,in_stack_fffffffffffffd80,in_stack_fffffffffffffd88,
               in_stack_fffffffffffffd90);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}